

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O0

void DATA_CONVERSION::ConvertSamplesToSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,default_random_engine *generator)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  reference pvVar7;
  result_type_conflict rVar8;
  float fVar9;
  float local_c4;
  int local_c0;
  float local_bc;
  int t;
  float intensity;
  float *activation;
  int sid;
  float maxDelta;
  int activationId_2;
  int idx;
  size_t inputSize;
  uniform_real_distribution<float> timeNoiseDistribution;
  uniform_real_distribution<float> distribution;
  int activationId_1;
  int sampleId;
  int activationId;
  undefined1 local_70 [8];
  vector<float,_std::allocator<float>_> maxValues;
  allocator<float> local_45;
  value_type_conflict local_44;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> minValues;
  default_random_engine *generator_local;
  float inputSimulationTime_local;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *spikeTrains_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *samples_local;
  
  minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)generator;
  bVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::empty(samples);
  if (!bVar2) {
    pvVar3 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    sVar4 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
    local_44 = 0.0;
    std::allocator<float>::allocator(&local_45);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_40,sVar4,&local_44,&local_45);
    std::allocator<float>::~allocator(&local_45);
    pvVar3 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    sVar4 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
    activationId = 0;
    std::allocator<float>::allocator((allocator<float> *)((long)&sampleId + 3));
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_70,sVar4,
               (value_type_conflict *)&activationId,(allocator<float> *)((long)&sampleId + 3));
    std::allocator<float>::~allocator((allocator<float> *)((long)&sampleId + 3));
    activationId_1 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      sVar4 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
      if (sVar4 <= (ulong)(long)activationId_1) break;
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)activationId_1);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,(long)activationId_1);
      *pvVar5 = vVar1;
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](samples,0);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)activationId_1);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_70,(long)activationId_1);
      *pvVar5 = vVar1;
      activationId_1 = activationId_1 + 1;
    }
    for (distribution._M_param._M_b = 0.0;
        sVar4 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(samples), (ulong)(long)(int)distribution._M_param._M_b < sVar4;
        distribution._M_param._M_b = (float)((int)distribution._M_param._M_b + 1)) {
      distribution._M_param._M_a = 0.0;
      while( true ) {
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,0);
        sVar4 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
        if (sVar4 <= (ulong)(long)(int)distribution._M_param._M_a) break;
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)distribution._M_param._M_b);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar3,(long)(int)distribution._M_param._M_a);
        fVar9 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_40,
                            (long)(int)distribution._M_param._M_a);
        if (fVar9 < *pvVar5) {
          pvVar3 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](samples,(long)(int)distribution._M_param._M_b);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar3,(long)(int)distribution._M_param._M_a);
          vVar1 = *pvVar5;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_40,
                              (long)(int)distribution._M_param._M_a);
          *pvVar5 = vVar1;
        }
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)distribution._M_param._M_b);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar3,(long)(int)distribution._M_param._M_a);
        fVar9 = *pvVar5;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_70,
                            (long)(int)distribution._M_param._M_a);
        if (*pvVar5 <= fVar9 && fVar9 != *pvVar5) {
          pvVar3 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](samples,(long)(int)distribution._M_param._M_b);
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar3,(long)(int)distribution._M_param._M_a);
          vVar1 = *pvVar5;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_70,
                              (long)(int)distribution._M_param._M_a);
          *pvVar5 = vVar1;
        }
        distribution._M_param._M_a = (float)((int)distribution._M_param._M_a + 1);
      }
    }
    std::uniform_real_distribution<float>::uniform_real_distribution(&timeNoiseDistribution,0.0,1.0)
    ;
    std::uniform_real_distribution<float>::uniform_real_distribution
              ((uniform_real_distribution<float> *)((long)&inputSize + 4),0.0,1e-06);
    pvVar3 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](samples,0);
    _activationId_2 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
    sVar4 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(samples);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar4);
    for (maxDelta = 0.0; uVar6 = (ulong)(int)maxDelta,
        sVar4 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(samples), uVar6 < sVar4; maxDelta = (float)((int)maxDelta + 1)) {
      pvVar7 = std::
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               ::operator[](spikeTrains,(long)(int)maxDelta);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(pvVar7,_activationId_2);
    }
    for (sid = 0; (ulong)(long)sid < _activationId_2; sid = sid + 1) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_70,(long)sid);
      fVar9 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_40,(long)sid);
      activation._4_4_ = fVar9 - *pvVar5;
      for (activation._0_4_ = 0; uVar6 = (ulong)(int)activation,
          sVar4 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::size(samples), uVar6 < sVar4; activation._0_4_ = (int)activation + 1) {
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](samples,(long)(int)activation);
        _t = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)sid);
        fVar9 = *_t;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_40,(long)sid);
        local_bc = (fVar9 - *pvVar5) / activation._4_4_;
        for (local_c0 = 0; (float)local_c0 < inputSimulationTime; local_c0 = local_c0 + 1) {
          rVar8 = std::uniform_real_distribution<float>::operator()
                            (&timeNoiseDistribution,
                             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                              *)minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          if (rVar8 < local_bc) {
            pvVar7 = std::
                     vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                     ::operator[](spikeTrains,(long)(int)activation);
            pvVar3 = std::
                     vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ::operator[](pvVar7,(long)sid);
            fVar9 = (float)local_c0;
            rVar8 = std::uniform_real_distribution<float>::operator()
                              ((uniform_real_distribution<float> *)((long)&inputSize + 4),
                               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                *)minValues.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_c4 = fVar9 + rVar8;
            std::vector<float,_std::allocator<float>_>::emplace_back<float>(pvVar3,&local_c4);
          }
        }
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_70);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_40);
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        std::default_random_engine &generator )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            for ( int t = 0; t < inputSimulationTime; ++t ) {
                if ( distribution( generator ) < intensity ) {
                    spikeTrains[sid][activationId].emplace_back((float) t + timeNoiseDistribution( generator ));
                }
            }
        }
    }
}